

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O0

void rotate(float *a,float r,float ux,float uy,float uz)

{
  float local_68;
  float local_64;
  float m [16];
  float c;
  float s;
  float uz_local;
  float uy_local;
  float ux_local;
  float r_local;
  float *a_local;
  
  sincosf((r * 3.1415927) / 180.0,m + 0xf,m + 0xe);
  local_68 = ux * ux * (1.0 - m[0xe]) + m[0xe];
  local_64 = uy * ux * (1.0 - m[0xe]) + uz * m[0xf];
  m[0] = ux * uz * (1.0 - m[0xe]) + -(uy * m[0xf]);
  m[1] = 0.0;
  m[2] = ux * uy * (1.0 - m[0xe]) + -(uz * m[0xf]);
  m[3] = uy * uy * (1.0 - m[0xe]) + m[0xe];
  m[4] = uy * uz * (1.0 - m[0xe]) + ux * m[0xf];
  m[5] = 0.0;
  m[6] = ux * uz * (1.0 - m[0xe]) + uy * m[0xf];
  m[7] = uy * uz * (1.0 - m[0xe]) + -(ux * m[0xf]);
  m[8] = uz * uz * (1.0 - m[0xe]) + m[0xe];
  m[9] = 0.0;
  m[10] = 0.0;
  m[0xb] = 0.0;
  m[0xc] = 0.0;
  m[0xd] = 1.0;
  multiply(a,&local_68);
  return;
}

Assistant:

static void rotate(float *a, float r, float ux, float uy, float uz)
{
  float s, c;

  sincosf(r * M_PI / 180, &s, &c);

  float m[16] = {
         ux * ux * (1 - c) + c, uy * ux * (1 - c) + uz * s, ux * uz * (1 - c) - uy * s, 0,
    ux * uy * (1 - c) - uz * s,      uy * uy * (1 - c) + c, uy * uz * (1 - c) + ux * s, 0,
    ux * uz * (1 - c) + uy * s, uy * uz * (1 - c) - ux * s,      uz * uz * (1 - c) + c, 0,
                             0,                          0,                          0, 1
  };

  multiply(a, m);
}